

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLoadAndStoreCase::iterate
          (ImageLoadAndStoreCase *this)

{
  TextureType TVar1;
  undefined8 uVar2;
  Vector<int,_3> *pVVar3;
  GLenum GVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  deUint32 dVar14;
  deUint32 dVar15;
  GLSLVersion version;
  GLuint GVar16;
  GLuint GVar17;
  RenderContext *context;
  undefined4 extraout_var;
  MessageBuilder *pMVar18;
  char *pcVar19;
  ProgramSources *sources;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  void *pvVar20;
  uint uVar21;
  RenderContext *renderContext;
  undefined8 extraout_RDX;
  TextureType local_eac;
  GLuint local_dbc;
  float local_db4;
  float local_db0;
  float local_dac;
  Vector<int,_2> local_d88;
  ImageLayerComparer local_d80;
  undefined1 local_d65;
  undefined1 local_d64 [7];
  bool compareOk;
  undefined1 local_d54 [8];
  Vec4 temp_1;
  undefined1 local_d34 [8];
  UVec4 temp;
  int x_2;
  int y_2;
  int z_2;
  undefined1 local_d08 [24];
  void *pixelData;
  int x_1;
  int y_1;
  void *data;
  undefined1 local_cd8 [4];
  int rowPitch;
  PixelBufferAccess sliceAccess;
  undefined1 local_ca8 [4];
  int z_1;
  PixelBufferAccess scratchAccess;
  TextureLevel scratch;
  int local_c50;
  int pixelSize;
  int layerNdx;
  UniformAccessLogger uniforms;
  string local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  byte local_bb6;
  byte local_bb5;
  int local_bb4;
  string local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  byte local_b6e;
  byte local_b6d;
  int local_b6c;
  string local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  string local_b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  ShaderSource local_888;
  ProgramSources local_860;
  undefined1 local_790 [8];
  ShaderProgram program;
  undefined1 local_6b8 [8];
  string glslVersionDeclaration;
  string shaderImageTypeStr;
  undefined1 local_670 [4];
  TextureType shaderImageType;
  string shaderImageFormatStr;
  char *maybeRestrict;
  MessageBuilder local_640;
  Vector<float,_4> local_4bc;
  Vector<float,_4> local_4ac;
  Vector<float,_4> local_49c;
  undefined1 local_48c [8];
  IVec4 color;
  int x;
  int y;
  int z;
  MessageBuilder local_468;
  deUint32 local_2e8;
  deUint32 local_2e4;
  MessageBuilder local_2e0;
  undefined1 local_160 [8];
  LayeredImage reference;
  Texture texture1;
  Texture texture0;
  Buffer texture1Buf;
  Buffer texture0Buf;
  bool isIntegerTextureFormat;
  int numSlicesOrFaces;
  float storeColorBias;
  float storeColorScale;
  int maxImageDimension;
  Vector<int,_3> *local_78;
  IVec3 *imageSize;
  TextureFormat TStack_68;
  deUint32 textureTargetGL;
  deUint32 local_60;
  deUint32 imageInternalFormatGL;
  TextureFormat local_50;
  deUint32 local_44;
  undefined1 local_40 [4];
  deUint32 textureInternalFormatGL;
  CallLogWrapper glLog;
  TestLog *log;
  RenderContext *renderCtx;
  ImageLoadAndStoreCase *this_local;
  
  context = Context::getRenderContext((this->super_TestCase).m_context);
  glLog._16_8_ = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  iVar7 = (*context->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_40,(Functions *)CONCAT44(extraout_var,iVar7),
             (TestLog *)glLog._16_8_);
  local_50 = this->m_textureFormat;
  local_44 = glu::getInternalFormat(local_50);
  TStack_68 = this->m_imageFormat;
  local_60 = glu::getInternalFormat(TStack_68);
  imageSize._4_4_ = Functional::getGLTextureTarget(this->m_textureType);
  defaultImageSize((Functional *)&storeColorScale,this->m_textureType);
  local_78 = (Vector<int,_3> *)&storeColorScale;
  iVar7 = tcu::Vector<int,_3>::x(local_78);
  iVar8 = tcu::Vector<int,_3>::y(local_78);
  iVar9 = tcu::Vector<int,_3>::z(local_78);
  iVar8 = de::max<int>(iVar8,iVar9);
  iVar7 = de::max<int>(iVar7,iVar8);
  bVar5 = isFormatTypeUnorm((this->m_textureFormat).type);
  if (bVar5) {
    local_dac = 1.0 / (float)(iVar7 + -1);
  }
  else {
    bVar5 = isFormatTypeSnorm((this->m_textureFormat).type);
    if (bVar5) {
      local_db0 = 2.0 / (float)(iVar7 + -1);
    }
    else {
      local_db0 = 1.0;
    }
    local_dac = local_db0;
  }
  bVar5 = isFormatTypeSnorm((this->m_textureFormat).type);
  local_db4 = -1.0;
  if (!bVar5) {
    local_db4 = 0.0;
  }
  if (this->m_textureType == TEXTURETYPE_CUBE) {
    local_dbc = 6;
  }
  else {
    local_dbc = tcu::Vector<int,_3>::z(local_78);
  }
  bVar5 = isFormatTypeInteger((this->m_textureFormat).type);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&texture1Buf.super_ObjectWrapper.m_object,
             context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&texture0.super_ObjectWrapper.m_object,
             context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&texture1.super_ObjectWrapper.m_object,
             context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&reference.m_tex2DArray.m_state,context);
  TVar1 = this->m_textureType;
  iVar7 = tcu::Vector<int,_3>::x(local_78);
  iVar8 = tcu::Vector<int,_3>::y(local_78);
  iVar9 = tcu::Vector<int,_3>::z(local_78);
  LayeredImage::LayeredImage
            ((LayeredImage *)local_160,TVar1,&this->m_textureFormat,iVar7,iVar8,iVar9);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_40,true);
  tcu::TestLog::operator<<
            (&local_2e0,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar18 = tcu::MessageBuilder::operator<<
                      (&local_2e0,(char (*) [30])"// Created 2 textures (names ");
  local_2e4 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1.super_ObjectWrapper.m_object)
  ;
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_2e4);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])0xf11459);
  local_2e8 = glu::ObjectWrapper::operator*((ObjectWrapper *)&reference.m_tex2DArray.m_state);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,&local_2e8);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [2])0xf2e642);
  tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2e0);
  if (this->m_textureType == TEXTURETYPE_BUFFER) {
    tcu::TestLog::operator<<
              (&local_468,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar18 = tcu::MessageBuilder::operator<<
                        (&local_468,(char (*) [44])"// Created buffers for the textures (names ");
    z = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1Buf.super_ObjectWrapper.m_object);
    pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(uint *)&z);
    pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [6])0xf11459);
    y = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture0.super_ObjectWrapper.m_object);
    pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(uint *)&y);
    pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [2])0xf2e642);
    tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_468);
  }
  for (x = 0; x < (int)local_dbc; x = x + 1) {
    for (color.m_data[3] = 0; iVar7 = color.m_data[3], iVar8 = tcu::Vector<int,_3>::y(local_78),
        iVar7 < iVar8; color.m_data[3] = color.m_data[3] + 1) {
      for (color.m_data[2] = 0; iVar7 = color.m_data[2], iVar8 = tcu::Vector<int,_3>::x(local_78),
          iVar7 < iVar8; color.m_data[2] = color.m_data[2] + 1) {
        uVar10 = color.m_data[2] ^ color.m_data[3];
        iVar8 = tcu::Vector<int,_3>::x(local_78);
        iVar7 = color.m_data[2];
        uVar11 = ~color.m_data[2] + iVar8 ^ color.m_data[3];
        iVar8 = tcu::Vector<int,_3>::y(local_78);
        uVar21 = ~color.m_data[3];
        iVar9 = tcu::Vector<int,_3>::x(local_78);
        uVar12 = ~color.m_data[2];
        iVar13 = tcu::Vector<int,_3>::y(local_78);
        tcu::Vector<int,_4>::Vector
                  ((Vector<int,_4> *)local_48c,uVar10 ^ x,uVar11 ^ x,iVar7 ^ uVar21 + iVar8 ^ x,
                   uVar12 + iVar9 ^ ~color.m_data[3] + iVar13 ^ x);
        iVar8 = color.m_data[3];
        iVar7 = color.m_data[2];
        if (bVar5) {
          (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                    ((LayeredImage *)local_160,color.m_data[2],color.m_data[3],x,
                     (Vector<int,_4> *)local_48c);
        }
        else {
          tcu::Vector<int,_4>::asFloat((Vector<int,_4> *)&local_4bc);
          tcu::operator*((tcu *)&local_4ac,&local_4bc,local_dac);
          tcu::operator+((tcu *)&local_49c,&local_4ac,local_db4);
          (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                    ((LayeredImage *)local_160,iVar7,iVar8,x,&local_49c);
        }
      }
    }
  }
  if (((this->m_imageFormat).type == HALF_FLOAT) && ((this->m_textureFormat).type != HALF_FLOAT)) {
    (anonymous_namespace)::ImageLoadAndStoreCase::
    replaceBadFloatReinterpretValues<(tcu::TextureFormat::ChannelType)34,tcu::Float<unsigned_short,5,10,15,3u>,unsigned_short>
              ((LayeredImage *)local_160,&this->m_imageFormat);
  }
  else if (((this->m_imageFormat).type == FLOAT) && ((this->m_textureFormat).type != FLOAT)) {
    (anonymous_namespace)::ImageLoadAndStoreCase::
    replaceBadFloatReinterpretValues<(tcu::TextureFormat::ChannelType)35,tcu::Float<unsigned_int,8,23,127,3u>,unsigned_int>
              ((LayeredImage *)local_160,&this->m_imageFormat);
  }
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c0);
  GVar4 = imageSize._4_4_;
  dVar14 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,GVar4,dVar14);
  setTexParameteri((CallLogWrapper *)local_40,imageSize._4_4_);
  tcu::TestLog::operator<<
            (&local_640,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar18 = tcu::MessageBuilder::operator<<(&local_640,(char (*) [20])"// Filling texture ");
  maybeRestrict._4_4_ =
       glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1.super_ObjectWrapper.m_object);
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(uint *)((long)&maybeRestrict + 4));
  pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [18])" with xor pattern");
  tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_640);
  dVar14 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture1Buf.super_ObjectWrapper.m_object)
  ;
  uploadTexture((CallLogWrapper *)local_40,(LayeredImage *)local_160,dVar14);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c1);
  GVar4 = imageSize._4_4_;
  dVar14 = glu::ObjectWrapper::operator*((ObjectWrapper *)&reference.m_tex2DArray.m_state);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,GVar4,dVar14);
  setTexParameteri((CallLogWrapper *)local_40,imageSize._4_4_);
  dVar14 = local_44;
  pVVar3 = local_78;
  TVar1 = this->m_textureType;
  dVar15 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture0.super_ObjectWrapper.m_object);
  setTextureStorage((CallLogWrapper *)local_40,TVar1,dVar14,pVVar3,dVar15);
  shaderImageFormatStr.field_2._8_8_ = "";
  if ((this->m_restrictImages & 1U) != 0) {
    shaderImageFormatStr.field_2._8_8_ = "restrict";
  }
  getShaderImageFormatQualifier_abi_cxx11_
            ((string *)local_670,(Functional *)&this->m_imageFormat,
             (TextureFormat *)CONCAT71((int7)((ulong)extraout_RDX >> 8),this->m_restrictImages));
  if ((this->m_singleLayerBind & 1U) == 0) {
    local_eac = this->m_textureType;
  }
  else {
    local_eac = textureLayerType(this->m_textureType);
  }
  renderContext = (RenderContext *)(ulong)local_eac;
  getShaderImageType_abi_cxx11_
            ((string *)((long)&glslVersionDeclaration.field_2 + 8),
             (Functional *)(ulong)(this->m_imageFormat).type,local_eac,local_eac);
  program.m_program.m_info.linkTimeUs._4_4_ = (*context->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion((ContextType)program.m_program.m_info.linkTimeUs._4_4_);
  pcVar19 = glu::getGLSLVersionDeclaration(version);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6b8,pcVar19,
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  glu::ProgramSources::ProgramSources(&local_860);
  std::operator+(&local_ae8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8,"\n"
                );
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_b08,(Functional *)(ulong)local_eac,(TextureType)context,renderContext);
  std::operator+(&local_ac8,&local_ae8,&local_b08);
  std::operator+(&local_aa8,&local_ac8,"\nprecision highp ");
  std::operator+(&local_a88,&local_aa8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_a68,&local_a88,
                 ";\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (")
  ;
  std::operator+(&local_a48,&local_a68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670);
  std::operator+(&local_a28,&local_a48,", binding=0) ");
  std::operator+(&local_a08,&local_a28,(char *)shaderImageFormatStr.field_2._8_8_);
  std::operator+(&local_9e8,&local_a08," readonly uniform ");
  std::operator+(&local_9c8,&local_9e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_9a8,&local_9c8," u_image0;\nlayout (");
  std::operator+(&local_988,&local_9a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670);
  std::operator+(&local_968,&local_988,", binding=1) ");
  std::operator+(&local_948,&local_968,(char *)shaderImageFormatStr.field_2._8_8_);
  std::operator+(&local_928,&local_948," writeonly uniform ");
  std::operator+(&local_908,&local_928,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_8e8,&local_908," u_image1;\n\nvoid main (void)\n{\n");
  local_b6d = 0;
  local_b6e = 0;
  local_bb5 = 0;
  local_bb6 = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
  if (local_eac == TEXTURETYPE_BUFFER) {
    local_b6c = tcu::Vector<int,_3>::x(local_78);
    local_b6c = local_b6c + -1;
    de::toString<int>(&local_b68,&local_b6c);
    local_b6d = 1;
    std::operator+(&local_b48,
                   "\tint pos = int(gl_GlobalInvocationID.x);\n\timageStore(u_image1, pos, imageLoad(u_image0, "
                   ,&local_b68);
    local_b6e = 1;
    std::operator+(&local_b28,&local_b48,"-pos));\n");
  }
  else if (local_eac == TEXTURETYPE_2D) {
    local_bb4 = tcu::Vector<int,_3>::x(local_78);
    local_bb4 = local_bb4 + -1;
    de::toString<int>(&local_bb0,&local_bb4);
    local_bb5 = 1;
    std::operator+(&local_b90,
                   "\tivec2 pos = ivec2(gl_GlobalInvocationID.xy);\n\timageStore(u_image1, pos, imageLoad(u_image0, ivec2("
                   ,&local_bb0);
    local_bb6 = 1;
    std::operator+(&local_b28,&local_b90,"-pos.x, pos.y)));\n");
  }
  else if (((local_eac == TEXTURETYPE_3D) || (local_eac == TEXTURETYPE_CUBE)) ||
          (local_eac == TEXTURETYPE_2D_ARRAY)) {
    iVar7 = tcu::Vector<int,_3>::x(local_78);
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = iVar7 + -1;
    de::toString<int>(&local_bf8,
                      (int *)((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count + 4));
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
    std::operator+(&local_bd8,
                   "\tivec3 pos = ivec3(gl_GlobalInvocationID);\n\timageStore(u_image1, pos, imageLoad(u_image0, ivec3("
                   ,&local_bf8);
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ = 1;
    std::operator+(&local_b28,&local_bd8,"-pos.x, pos.y, pos.z)));\n");
  }
  else {
    std::allocator<char>::allocator();
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b28,(char *)0x0,
               (allocator<char> *)
               ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
               + 1));
  }
  std::operator+(&local_8c8,&local_8e8,&local_b28);
  std::operator+(&local_8a8,&local_8c8,"}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_888,&local_8a8);
  sources = glu::ProgramSources::operator<<(&local_860,&local_888);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_790,context,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_888);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_b28);
  if (((byte)uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count & 1) != 0)
  {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
               + 1));
  }
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._2_1_ & 1) != 0)
  {
    std::__cxx11::string::~string((string *)&local_bd8);
  }
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) != 0)
  {
    std::__cxx11::string::~string((string *)&local_bf8);
  }
  if ((local_bb6 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b90);
  }
  if ((local_bb5 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_bb0);
  }
  if ((local_b6e & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b48);
  }
  if ((local_b6d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b68);
  }
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::~string((string *)&local_ae8);
  glu::ProgramSources::~ProgramSources(&local_860);
  iVar7 = (*context->_vptr_RenderContext[3])();
  uVar2 = glLog._16_8_;
  dVar14 = glu::ShaderProgram::getProgram((ShaderProgram *)local_790);
  UniformAccessLogger::UniformAccessLogger
            ((UniformAccessLogger *)&layerNdx,(Functions *)CONCAT44(extraout_var_00,iVar7),
             (TestLog *)uVar2,dVar14);
  glu::operator<<((TestLog *)glLog._16_8_,(ShaderProgram *)local_790);
  bVar6 = glu::ShaderProgram::isOk((ShaderProgram *)local_790);
  if (bVar6) {
    dVar14 = glu::ShaderProgram::getProgram((ShaderProgram *)local_790);
    glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_40,dVar14);
    if ((this->m_singleLayerBind & 1U) == 0) {
      dVar14 = glu::ObjectWrapper::operator*
                         ((ObjectWrapper *)&texture1.super_ObjectWrapper.m_object);
      glu::CallLogWrapper::glBindImageTexture
                ((CallLogWrapper *)local_40,0,dVar14,0,'\x01',0,35000,local_60);
      iVar7 = (*context->_vptr_RenderContext[3])();
      dVar14 = (**(code **)(CONCAT44(extraout_var_04,iVar7) + 0x800))();
      glu::checkError(dVar14,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d0);
      dVar14 = glu::ObjectWrapper::operator*((ObjectWrapper *)&reference.m_tex2DArray.m_state);
      glu::CallLogWrapper::glBindImageTexture
                ((CallLogWrapper *)local_40,1,dVar14,0,'\x01',0,0x88b9,local_60);
      iVar7 = (*context->_vptr_RenderContext[3])();
      dVar14 = (**(code **)(CONCAT44(extraout_var_05,iVar7) + 0x800))();
      glu::checkError(dVar14,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d3);
      GVar16 = tcu::Vector<int,_3>::x(local_78);
      GVar17 = tcu::Vector<int,_3>::y(local_78);
      glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)local_40,GVar16,GVar17,local_dbc);
      iVar7 = (*context->_vptr_RenderContext[3])();
      dVar14 = (**(code **)(CONCAT44(extraout_var_06,iVar7) + 0x800))();
      glu::checkError(dVar14,"glDispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d6);
    }
    else {
      for (local_c50 = 0; local_c50 < (int)local_dbc; local_c50 = local_c50 + 1) {
        if (0 < local_c50) {
          glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)local_40,0x20);
        }
        dVar14 = glu::ObjectWrapper::operator*
                           ((ObjectWrapper *)&texture1.super_ObjectWrapper.m_object);
        glu::CallLogWrapper::glBindImageTexture
                  ((CallLogWrapper *)local_40,0,dVar14,0,'\0',local_c50,35000,local_60);
        iVar7 = (*context->_vptr_RenderContext[3])();
        dVar14 = (**(code **)(CONCAT44(extraout_var_01,iVar7) + 0x800))();
        glu::checkError(dVar14,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x5c4);
        dVar14 = glu::ObjectWrapper::operator*((ObjectWrapper *)&reference.m_tex2DArray.m_state);
        glu::CallLogWrapper::glBindImageTexture
                  ((CallLogWrapper *)local_40,1,dVar14,0,'\0',local_c50,0x88b9,local_60);
        iVar7 = (*context->_vptr_RenderContext[3])();
        dVar14 = (**(code **)(CONCAT44(extraout_var_02,iVar7) + 0x800))();
        glu::checkError(dVar14,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x5c7);
        GVar16 = tcu::Vector<int,_3>::x(local_78);
        GVar17 = tcu::Vector<int,_3>::y(local_78);
        glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)local_40,GVar16,GVar17,1);
        iVar7 = (*context->_vptr_RenderContext[3])();
        dVar14 = (**(code **)(CONCAT44(extraout_var_03,iVar7) + 0x800))();
        glu::checkError(dVar14,"glDispatchCompute",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x5ca);
      }
    }
    bVar6 = tcu::TextureFormat::operator!=(&this->m_textureFormat,&this->m_imageFormat);
    if (bVar6) {
      iVar7 = tcu::TextureFormat::getPixelSize(&this->m_imageFormat);
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&scratchAccess.super_ConstPixelBufferAccess.m_data,
                 &this->m_imageFormat,1,1,1);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)local_ca8,
                 (TextureLevel *)&scratchAccess.super_ConstPixelBufferAccess.m_data);
      for (sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ = CUBEFACE_NEGATIVE_X;
          (int)sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ < (int)local_dbc;
          sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
               sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_ + CUBEFACE_POSITIVE_X) {
        if (this->m_textureType == TEXTURETYPE_CUBE) {
          LayeredImage::getCubeFaceAccess
                    ((PixelBufferAccess *)local_cd8,(LayeredImage *)local_160,
                     sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_);
        }
        else {
          LayeredImage::getSliceAccess
                    ((PixelBufferAccess *)local_cd8,(LayeredImage *)local_160,
                     sliceAccess.super_ConstPixelBufferAccess.m_data._4_4_);
        }
        data._4_4_ = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)local_cd8);
        _x_1 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_cd8);
        for (pixelData._4_4_ = 0; iVar8 = pixelData._4_4_, iVar9 = tcu::Vector<int,_3>::y(local_78),
            iVar8 < iVar9; pixelData._4_4_ = pixelData._4_4_ + 1) {
          for (pixelData._0_4_ = 0; iVar8 = (int)pixelData, iVar9 = tcu::Vector<int,_3>::x(local_78)
              , iVar8 < iVar9; pixelData._0_4_ = (int)pixelData + 1) {
            local_d08._16_8_ =
                 (long)_x_1 + (long)((int)pixelData * iVar7) + (long)(pixelData._4_4_ * data._4_4_);
            pvVar20 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_ca8);
            ::deMemcpy(pvVar20,(void *)local_d08._16_8_,(long)iVar7);
            bVar6 = isFormatTypeInteger((this->m_imageFormat).type);
            if (bVar6) {
              tcu::ConstPixelBufferAccess::getPixelUint
                        ((ConstPixelBufferAccess *)local_d08,(int)local_ca8,0,0);
              tcu::PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)local_ca8,(UVec4 *)local_d08,0,0,0);
            }
            else {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)&y_2,(int)local_ca8,0,0);
              tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)local_ca8,(Vec4 *)&y_2,0,0,0);
            }
            uVar2 = local_d08._16_8_;
            pvVar20 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)local_ca8);
            ::deMemcpy((void *)uVar2,pvVar20,(long)iVar7);
          }
        }
      }
      tcu::TextureLevel::~TextureLevel
                ((TextureLevel *)&scratchAccess.super_ConstPixelBufferAccess.m_data);
    }
    for (x_2 = 0; x_2 < (int)local_dbc; x_2 = x_2 + 1) {
      for (temp.m_data[3] = 0; uVar10 = temp.m_data[3], iVar7 = tcu::Vector<int,_3>::y(local_78),
          (int)uVar10 < iVar7; temp.m_data[3] = temp.m_data[3] + 1) {
        for (temp.m_data[2] = 0; uVar10 = temp.m_data[2], iVar7 = tcu::Vector<int,_3>::x(local_78),
            (int)uVar10 < iVar7 / 2; temp.m_data[2] = temp.m_data[2] + 1) {
          if (bVar5) {
            iVar7 = tcu::Vector<int,_3>::x(local_78);
            LayeredImage::getPixelUint
                      ((LayeredImage *)local_d34,(int)local_160,~temp.m_data[2] + iVar7,
                       temp.m_data[3]);
            iVar7 = tcu::Vector<int,_3>::x(local_78);
            uVar10 = temp.m_data[3];
            uVar11 = ~temp.m_data[2];
            LayeredImage::getPixelUint
                      ((LayeredImage *)(temp_1.m_data + 2),(int)local_160,temp.m_data[2],
                       temp.m_data[3]);
            (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
                      ((LayeredImage *)local_160,uVar11 + iVar7,uVar10,x_2,
                       (Vector<unsigned_int,_4> *)(temp_1.m_data + 2));
            (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
                      ((LayeredImage *)local_160,temp.m_data[2],temp.m_data[3],x_2,
                       (Vector<unsigned_int,_4> *)local_d34);
          }
          else {
            iVar7 = tcu::Vector<int,_3>::x(local_78);
            LayeredImage::getPixel
                      ((LayeredImage *)local_d54,(int)local_160,~temp.m_data[2] + iVar7,
                       temp.m_data[3]);
            iVar7 = tcu::Vector<int,_3>::x(local_78);
            uVar10 = temp.m_data[3];
            uVar11 = ~temp.m_data[2];
            LayeredImage::getPixel
                      ((LayeredImage *)local_d64,(int)local_160,temp.m_data[2],temp.m_data[3]);
            (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                      ((LayeredImage *)local_160,uVar11 + iVar7,uVar10,x_2,
                       (Vector<float,_4> *)local_d64);
            (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                      ((LayeredImage *)local_160,temp.m_data[2],temp.m_data[3],x_2,
                       (Vector<float,_4> *)local_d54);
          }
        }
      }
    }
    bVar5 = false;
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
    this_local._4_4_ = STOP;
    bVar5 = true;
  }
  UniformAccessLogger::~UniformAccessLogger((UniformAccessLogger *)&layerNdx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_790);
  std::__cxx11::string::~string((string *)local_6b8);
  std::__cxx11::string::~string((string *)(glslVersionDeclaration.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_670);
  if (!bVar5) {
    dVar14 = glu::ObjectWrapper::operator*((ObjectWrapper *)&reference.m_tex2DArray.m_state);
    dVar15 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture0.super_ObjectWrapper.m_object);
    pVVar3 = local_78;
    TVar1 = this->m_textureType;
    tcu::Vector<int,_2>::Vector(&local_d88,0);
    ImageLayerComparer::ImageLayerComparer(&local_d80,(LayeredImage *)local_160,&local_d88);
    bVar5 = readTextureAndVerify
                      (context,(CallLogWrapper *)local_40,dVar14,dVar15,TVar1,&this->m_textureFormat
                       ,pVVar3,&local_d80.super_ImageLayerVerifier);
    ImageLayerComparer::~ImageLayerComparer(&local_d80);
    pcVar19 = "Image comparison failed";
    if (bVar5) {
      pcVar19 = "Pass";
    }
    local_d65 = bVar5;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar5 & QP_TEST_RESULT_FAIL,pcVar19);
    this_local._4_4_ = STOP;
  }
  LayeredImage::~LayeredImage((LayeredImage *)local_160);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&reference.m_tex2DArray.m_state);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&texture1.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&texture0.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&texture1Buf.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_40);
  return this_local._4_4_;
}

Assistant:

ImageLoadAndStoreCase::IterateResult ImageLoadAndStoreCase::iterate (void)
{
	const RenderContext&		renderCtx					= m_context.getRenderContext();
	TestLog&					log							(m_testCtx.getLog());
	glu::CallLogWrapper			glLog						(renderCtx.getFunctions(), log);
	const deUint32				textureInternalFormatGL		= glu::getInternalFormat(m_textureFormat);
	const deUint32				imageInternalFormatGL		= glu::getInternalFormat(m_imageFormat);
	const deUint32				textureTargetGL				= getGLTextureTarget(m_textureType);
	const IVec3&				imageSize					= defaultImageSize(m_textureType);
	const int					maxImageDimension			= de::max(imageSize.x(), de::max(imageSize.y(), imageSize.z()));
	const float					storeColorScale				= isFormatTypeUnorm(m_textureFormat.type) ? 1.0f / (float)(maxImageDimension - 1)
															: isFormatTypeSnorm(m_textureFormat.type) ? 2.0f / (float)(maxImageDimension - 1)
															: 1.0f;
	const float					storeColorBias				= isFormatTypeSnorm(m_textureFormat.type) ? -1.0f : 0.0f;
	const int					numSlicesOrFaces			= m_textureType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isIntegerTextureFormat		= isFormatTypeInteger(m_textureFormat.type);
	const glu::Buffer			texture0Buf					(renderCtx);
	const glu::Buffer			texture1Buf					(renderCtx);
	const glu::Texture			texture0					(renderCtx);
	const glu::Texture			texture1					(renderCtx);
	LayeredImage				reference					(m_textureType, m_textureFormat, imageSize.x(), imageSize.y(), imageSize.z());

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created 2 textures (names " << *texture0 << " and " << *texture1 << ")" << TestLog::EndMessage;
	if (m_textureType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created buffers for the textures (names " << *texture0Buf << " and " << *texture1Buf << ")" << TestLog::EndMessage;

	// First, fill reference with (a fairly arbitrary) initial pattern. This will be used as texture upload source data as well as for actual reference computation later on.

	DE_ASSERT(!isIntegerTextureFormat || (storeColorScale == 1.0f && storeColorBias == 0.0f));

	for (int z = 0; z < numSlicesOrFaces; z++)
	for (int y = 0; y < imageSize.y(); y++)
	for (int x = 0; x < imageSize.x(); x++)
	{
		const IVec4 color(x^y^z, (imageSize.x()-1-x)^y^z, x^(imageSize.y()-1-y)^z, (imageSize.x()-1-x)^(imageSize.y()-1-y)^z);

		if (isIntegerTextureFormat)
			reference.setPixel(x, y, z, color);
		else
			reference.setPixel(x, y, z, color.asFloat()*storeColorScale + storeColorBias);
	}

	// If re-interpreting the texture contents as floating point values, need to get rid of inf, nan etc.
	if (m_imageFormat.type == TextureFormat::HALF_FLOAT && m_textureFormat.type != TextureFormat::HALF_FLOAT)
		replaceBadFloatReinterpretValues<TextureFormat::HALF_FLOAT, tcu::Float16, deUint16>(reference, m_imageFormat);
	else if (m_imageFormat.type == TextureFormat::FLOAT && m_textureFormat.type != TextureFormat::FLOAT)
		replaceBadFloatReinterpretValues<TextureFormat::FLOAT, tcu::Float32, deUint32>(reference, m_imageFormat);

	// Upload initial pattern to texture 0.

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *texture0);
	setTexParameteri(glLog, textureTargetGL);

	log << TestLog::Message << "// Filling texture " << *texture0 << " with xor pattern" << TestLog::EndMessage;

	uploadTexture(glLog, reference, *texture0Buf);

	// Set storage for texture 1.

	glLog.glActiveTexture(GL_TEXTURE1);
	glLog.glBindTexture(textureTargetGL, *texture1);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_textureType, textureInternalFormatGL, imageSize, *texture1Buf);

	// Perform image loads and stores in compute shader and finalize reference computation.

	{
		// Generate compute shader.

		const char* const		maybeRestrict			= m_restrictImages ? "restrict" : "";
		const string			shaderImageFormatStr	= getShaderImageFormatQualifier(m_imageFormat);
		const TextureType		shaderImageType			= m_singleLayerBind ? textureLayerType(m_textureType) : m_textureType;
		const string			shaderImageTypeStr		= getShaderImageType(m_imageFormat.type, shaderImageType);
		const std::string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(shaderImageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) " + maybeRestrict + " readonly uniform " + shaderImageTypeStr + " u_image0;\n"
														"layout (" + shaderImageFormatStr + ", binding=1) " + maybeRestrict + " writeonly uniform " + shaderImageTypeStr + " u_image1;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														+ (shaderImageType == TEXTURETYPE_BUFFER ?
															"	int pos = int(gl_GlobalInvocationID.x);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, " + toString(imageSize.x()-1) + "-pos));\n"
														 : shaderImageType == TEXTURETYPE_2D ?
															"	ivec2 pos = ivec2(gl_GlobalInvocationID.xy);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, ivec2(" + toString(imageSize.x()-1) + "-pos.x, pos.y)));\n"
														 : shaderImageType == TEXTURETYPE_3D || shaderImageType == TEXTURETYPE_CUBE || shaderImageType == TEXTURETYPE_2D_ARRAY ?
															"	ivec3 pos = ivec3(gl_GlobalInvocationID);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, ivec3(" + toString(imageSize.x()-1) + "-pos.x, pos.y, pos.z)));\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		if (m_singleLayerBind)
		{
			for (int layerNdx = 0; layerNdx < numSlicesOrFaces; layerNdx++)
			{
				if (layerNdx > 0)
					glLog.glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

				glLog.glBindImageTexture(0, *texture0, 0, GL_FALSE, layerNdx, GL_READ_ONLY, imageInternalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glBindImageTexture(1, *texture1, 0, GL_FALSE, layerNdx, GL_WRITE_ONLY, imageInternalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glDispatchCompute(imageSize.x(), imageSize.y(), 1);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
			}
		}
		else
		{
			glLog.glBindImageTexture(0, *texture0, 0, GL_TRUE, 0, GL_READ_ONLY, imageInternalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glBindImageTexture(1, *texture1, 0, GL_TRUE, 0, GL_WRITE_ONLY, imageInternalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glDispatchCompute(imageSize.x(), imageSize.y(), numSlicesOrFaces);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
		}

		// Finalize reference.

		if (m_textureFormat != m_imageFormat)
		{
			// Format re-interpretation case. Read data with image format and write back, with the same image format.
			// We do this because the data may change a little during lookups (e.g. unorm8 -> float; not all unorms can be exactly represented as floats).

			const int					pixelSize		= m_imageFormat.getPixelSize();
			tcu::TextureLevel			scratch			(m_imageFormat, 1, 1);
			const PixelBufferAccess		scratchAccess	= scratch.getAccess();

			for (int z = 0; z < numSlicesOrFaces; z++)
			{
				const PixelBufferAccess		sliceAccess		= m_textureType == TEXTURETYPE_CUBE ? reference.getCubeFaceAccess((tcu::CubeFace)z) : reference.getSliceAccess(z);
				const int					rowPitch		= sliceAccess.getRowPitch();
				void *const					data			= sliceAccess.getDataPtr();

				for (int y = 0; y < imageSize.y(); y++)
				for (int x = 0; x < imageSize.x(); x++)
				{
					void *const pixelData = (deUint8*)data + y*rowPitch + x*pixelSize;

					deMemcpy(scratchAccess.getDataPtr(), pixelData, pixelSize);

					if (isFormatTypeInteger(m_imageFormat.type))
						scratchAccess.setPixel(scratchAccess.getPixelUint(0, 0), 0, 0);
					else
						scratchAccess.setPixel(scratchAccess.getPixel(0, 0), 0, 0);

					deMemcpy(pixelData, scratchAccess.getDataPtr(), pixelSize);
				}
			}
		}

		for (int z = 0; z < numSlicesOrFaces; z++)
		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x()/2; x++)
		{
			if (isIntegerTextureFormat)
			{
				const UVec4 temp = reference.getPixelUint(imageSize.x()-1-x, y, z);
				reference.setPixel(imageSize.x()-1-x, y, z, reference.getPixelUint(x, y, z));
				reference.setPixel(x, y, z, temp);
			}
			else
			{
				const Vec4 temp = reference.getPixel(imageSize.x()-1-x, y, z);
				reference.setPixel(imageSize.x()-1-x, y, z, reference.getPixel(x, y, z));
				reference.setPixel(x, y, z, temp);
			}
		}
	}

	// Read texture 1 and compare to reference.

	const bool compareOk = readTextureAndVerify(renderCtx, glLog, *texture1, *texture1Buf, m_textureType, m_textureFormat, imageSize, ImageLayerComparer(reference));

	m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, compareOk ? "Pass" : "Image comparison failed");
	return STOP;
}